

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O3

void __thiscall
nuraft::raft_server::auto_fwd_release_rpc_cli
          (raft_server *this,ptr<auto_fwd_pkg> *cur_pkg,ptr<rpc_client> *rpc_cli)

{
  uint uVar1;
  _List_node_base *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  undefined8 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  int iVar7;
  unique_lock<std::mutex> ll;
  unique_lock<std::mutex> l;
  auto_fwd_req_resp entry;
  ptr<raft_params> params;
  anon_class_32_4_602b9eac put_back_to_idle_list;
  unique_lock<std::mutex> local_108;
  unique_lock<std::mutex> local_f8;
  undefined8 *local_e8;
  undefined8 local_e0;
  code *local_d8;
  code *local_d0;
  _List_node_base *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
  local_b8;
  undefined1 local_a8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  raft_server *local_58;
  undefined1 local_48 [32];
  
  context::get_params((context *)local_a8);
  uVar1 = *(uint *)((long)&((element_type *)(local_a8._0_8_ + 0x48))->_vptr_state_mgr + 4);
  iVar7 = *(int *)&((element_type *)(local_a8._0_8_ + 0x58))->_vptr_state_mgr;
  local_48._16_8_ = 1;
  if (1 < (int)uVar1) {
    local_48._16_8_ = ZEXT48(uVar1);
  }
  local_f8._M_device =
       &((cur_pkg->super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr)->lock_;
  local_f8._M_owns = false;
  local_48._0_8_ = cur_pkg;
  local_48._8_8_ = rpc_cli;
  local_48._24_8_ = this;
  std::unique_lock<std::mutex>::lock(&local_f8);
  local_f8._M_owns = true;
  if (iVar7 == 0) {
    auto_fwd_release_rpc_cli::anon_class_32_4_602b9eac::operator()
              ((anon_class_32_4_602b9eac *)local_48);
    EventAwaiter::invoke
              (&((cur_pkg->
                 super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->ea_);
  }
  else {
    local_108._M_device = &this->auto_fwd_reqs_lock_;
    local_108._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_108);
    local_108._M_owns = true;
    p_Var2 = (this->auto_fwd_reqs_).
             super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&this->auto_fwd_reqs_) {
      std::unique_lock<std::mutex>::unlock(&local_108);
      auto_fwd_release_rpc_cli::anon_class_32_4_602b9eac::operator()
                ((anon_class_32_4_602b9eac *)local_48);
    }
    else {
      local_c8 = p_Var2[1]._M_next;
      local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[1]._M_prev;
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_c0->_M_use_count = local_c0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_c0->_M_use_count = local_c0->_M_use_count + 1;
        }
      }
      local_b8.
      super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)p_Var2[2]._M_next;
      local_b8.
      super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[2]._M_prev;
      if (local_b8.
          super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_b8.
           super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_b8.
                super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_b8.
           super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_b8.
                super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::__cxx11::
      list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
      ::_M_erase(&this->auto_fwd_reqs_,
                 (this->auto_fwd_reqs_).
                 super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                 ._M_impl._M_node.super__List_node_base._M_next);
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 != (element_type *)0x0) {
        iVar7 = (**(code **)(*(long *)peVar3 + 0x38))();
        if (5 < iVar7) {
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)(local_a8 + 0x10),
                     "found waiting request in the queue, remaining elems %zu",
                     (this->auto_fwd_reqs_).
                     super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                     ._M_impl._M_node._M_size);
          (**(code **)(*(long *)peVar3 + 0x40))
                    (peVar3,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"auto_fwd_release_rpc_cli",0x137,local_a8 + 0x10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._16_8_ != &local_88) {
            operator_delete((void *)local_a8._16_8_);
          }
        }
      }
      std::unique_lock<std::mutex>::unlock(&local_108);
      local_a8._16_8_ = auto_fwd_resp_handler;
      _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::
      _Tuple_impl<1ul,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>>
      ::
      _Tuple_impl<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>&,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>&,std::shared_ptr<nuraft::rpc_client>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,void>
                ((_Tuple_impl<1ul,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>>
                  *)local_88._M_local_buf,&local_b8,cur_pkg,rpc_cli,
                 (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2
                );
      local_e0 = 0;
      local_58 = this;
      local_e8 = (undefined8 *)operator_new(0x48);
      _Var6._M_pi = _Stack_70._M_pi;
      uVar5 = local_88._8_8_;
      *local_e8 = local_a8._16_8_;
      local_e8[1] = _Stack_90._M_pi;
      local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_e8[2] = local_88._M_allocated_capacity;
      local_e8[3] = uVar5;
      local_88._M_allocated_capacity = 0;
      _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_e8[4] = local_78;
      local_e8[5] = _Var6._M_pi;
      local_78 = (element_type *)0x0;
      local_e8[6] = local_68;
      local_e8[7] = _Stack_60._M_pi;
      local_e8[8] = this;
      local_d0 = std::
                 _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
                 ::_M_invoke;
      local_d8 = std::
                 _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
                 ::_M_manager;
      std::unique_lock<std::mutex>::unlock(&local_f8);
      peVar4 = (rpc_cli->super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar4->_vptr_rpc_client[2])
                (peVar4,&local_c8,&local_e8,
                 (long)*(int *)((long)&((element_type *)(local_a8._0_8_ + 0x58))->_vptr_state_mgr +
                               4));
      if (local_d8 != (code *)0x0) {
        (*local_d8)(&local_e8,&local_e8,3);
      }
      if (local_b8.
          super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.
                   super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_108);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_f8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  return;
}

Assistant:

void raft_server::auto_fwd_release_rpc_cli( ptr<auto_fwd_pkg> cur_pkg,
                                            ptr<rpc_client> rpc_cli )
{
    ptr<raft_params> params = ctx_->get_params();
    size_t max_conns =
        std::max(1, params->auto_forwarding_max_connections_);
    bool is_blocking_mode = (params->return_method_ == raft_params::blocking);

    auto put_back_to_idle_list = [&cur_pkg, &rpc_cli, max_conns, this]() {
        cur_pkg->rpc_client_in_use_.erase(rpc_cli);
        cur_pkg->rpc_client_idle_.push_front(rpc_cli);
        p_tr( "release connection %p, idle %zu, in-use %zu, max %zu",
              rpc_cli.get(),
              cur_pkg->rpc_client_idle_.size(),
              cur_pkg->rpc_client_in_use_.size(),
              max_conns );
    };

    std::unique_lock<std::mutex> l(cur_pkg->lock_);
    if (is_blocking_mode) {
        // Blocking mode, put the connection back to idle list,
        // and wake up the sleeping thread.
        put_back_to_idle_list();
        cur_pkg->ea_.invoke();

    } else {
        // Async mode, send the request in the queue.
        std::unique_lock<std::mutex> ll(auto_fwd_reqs_lock_);
        if (!auto_fwd_reqs_.empty()) {
            auto_fwd_req_resp entry = *auto_fwd_reqs_.begin();
            auto_fwd_reqs_.pop_front();
            p_tr( "found waiting request in the queue, remaining elems %zu",
                  auto_fwd_reqs_.size() );
            ll.unlock();

            rpc_handler handler = std::bind( &raft_server::auto_fwd_resp_handler,
                                             this,
                                             entry.resp,
                                             cur_pkg,
                                             rpc_cli,
                                             std::placeholders::_1,
                                             std::placeholders::_2 );

            // Should be unlocked before calling `send`, as resp handler can be
            // invoked in the same thread in case of error.
            l.unlock();
            rpc_cli->send(entry.req, handler, params->auto_forwarding_req_timeout_);

        } else {
            // If no request is waiting, put the connection back to idle list.
            ll.unlock();
            put_back_to_idle_list();
        }
    }
}